

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O3

void __thiscall
QtMWidgets::AbstractListView<QImage>::mousePressEvent(AbstractListView<QImage> *this,QMouseEvent *e)

{
  AbstractScrollAreaPrivate *pAVar1;
  long lVar2;
  
  AbstractScrollArea::mousePressEvent((AbstractScrollArea *)this,e);
  if (*(int *)(e + 0x40) == 1) {
    pAVar1 = (this->super_AbstractListViewBase).super_AbstractScrollArea.d.d;
    lVar2 = QElapsedTimer::elapsed();
    if (500 < lVar2) {
      *(undefined4 *)((long)&pAVar1[1].indicatorColor.ct + 8) = 0;
    }
    *(undefined4 *)((long)&pAVar1[1].indicatorColor.ct + 4) = 0;
    QTimer::start((int)pAVar1[1].viewport);
    QElapsedTimer::start();
    return;
  }
  return;
}

Assistant:

void mousePressEvent( QMouseEvent * e ) override
	{
		AbstractListViewBase::mousePressEvent( e );

		AbstractListViewPrivate< T > * d = d_func();

		if( e->button() == Qt::LeftButton )
		{
			if( d->elapsedTimer.elapsed() > 500 )
				d->clickCount = 0;

			d->mouseMoveDelta = 0;
			d->timer->start( 2000 );
			d->elapsedTimer.start();
		}
	}